

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void check_decl_align(c2m_ctx_t c2m_ctx,decl_spec *decl_spec)

{
  int iVar1;
  int iVar2;
  pos_t pVar3;
  char *local_28;
  undefined8 local_20;
  decl_spec *decl_spec_local;
  c2m_ctx_t c2m_ctx_local;
  
  if ((-1 < decl_spec->align) &&
     (iVar1 = decl_spec->align, iVar2 = type_align(decl_spec->type), iVar1 < iVar2)) {
    pVar3 = get_node_pos(c2m_ctx,decl_spec->align_node);
    local_28 = pVar3.fname;
    local_20 = pVar3._8_8_;
    error(c2m_ctx,0x1d6cf4,local_28,local_20);
  }
  return;
}

Assistant:

static void check_decl_align (c2m_ctx_t c2m_ctx, struct decl_spec *decl_spec) {
  if (decl_spec->align < 0) return;
  if (decl_spec->align < type_align (decl_spec->type))
    error (c2m_ctx, POS (decl_spec->align_node),
           "requested alignment is less than minimum alignment for the type");
}